

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

size_t Curl_strlen_url(char *url,_Bool relative)

{
  byte bVar1;
  _Bool _Var2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  undefined3 in_register_00000031;
  size_t sVar6;
  
  pcVar3 = url;
  if (CONCAT31(in_register_00000031,relative) == 0) {
    pcVar3 = find_host_sep(url);
  }
  bVar1 = *url;
  if (bVar1 == 0) {
    sVar6 = 0;
  }
  else {
    bVar5 = true;
    sVar6 = 0;
    do {
      if (url < pcVar3) {
LAB_0013155d:
        sVar6 = sVar6 + 1;
      }
      else if (bVar1 == 0x20) {
        if (!bVar5) goto LAB_0013155d;
        sVar6 = sVar6 + 3;
      }
      else {
        if (bVar1 == 0x3f) {
          bVar5 = false;
        }
        _Var2 = urlchar_needs_escaping((uint)bVar1);
        sVar4 = sVar6 + 2;
        if (!_Var2) {
          sVar4 = sVar6;
        }
        sVar6 = sVar4 + 1;
      }
      bVar1 = url[1];
      url = url + 1;
    } while (bVar1 != 0);
  }
  return sVar6;
}

Assistant:

size_t Curl_strlen_url(const char *url, bool relative)
{
  const unsigned char *ptr;
  size_t newlen = 0;
  bool left = TRUE; /* left side of the ? */
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(ptr = (unsigned char *)url; *ptr; ptr++) {

    if(ptr < host_sep) {
      ++newlen;
      continue;
    }

    switch(*ptr) {
    case '?':
      left = FALSE;
      /* FALLTHROUGH */
    default:
      if(urlchar_needs_escaping(*ptr))
        newlen += 2;
      newlen++;
      break;
    case ' ':
      if(left)
        newlen += 3;
      else
        newlen++;
      break;
    }
  }
  return newlen;
}